

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_ManPrintClasseSizes(Iso_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Iso_Obj_t *pIVar3;
  ulong uVar4;
  long lVar5;
  
  pVVar2 = p->vClasses;
  if (0 < pVVar2->nSize) {
    lVar5 = 0;
    do {
      pIVar3 = (Iso_Obj_t *)pVVar2->pArray[lVar5];
      uVar4 = 0;
      if (pIVar3 != (Iso_Obj_t *)0x0) {
        uVar4 = 0;
        do {
          iVar1 = pIVar3->iClass;
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                          ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
          }
          if (iVar1 == 0) {
            pIVar3 = (Iso_Obj_t *)0x0;
          }
          else {
            pIVar3 = p->pObjs + iVar1;
          }
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (pIVar3 != (Iso_Obj_t *)0x0);
      }
      printf("%d ",uVar4);
      lVar5 = lVar5 + 1;
      pVVar2 = p->vClasses;
    } while (lVar5 < pVVar2->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Iso_ManPrintClasseSizes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i, Counter;
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        Counter = 0;
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
}